

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpt-op.c
# Opt level: O3

int gpt_probe_label(hd_context *ctx,gpt_disk *disk)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uint32_t uVar4;
  int iVar5;
  long lVar6;
  gpt_header *header;
  __off_t _Var7;
  ulong uVar8;
  gpt_entry *ents;
  off_t offset;
  ulong __size;
  
  puVar3 = disk->first_sector;
  if (puVar3 == (uchar *)0x0) {
    return 0;
  }
  if (*(short *)(puVar3 + 0x1fe) != -0x55ab) {
    return 0;
  }
  lVar6 = 0;
  while (puVar3[lVar6 + 0x1c2] != 0xee) {
    lVar6 = lVar6 + 0x10;
    if (lVar6 == 0x40) {
      return 0;
    }
  }
  if (disk == (gpt_disk *)0x0) goto LAB_00102bdc;
  __size = (ulong)(disk->super).sector_size;
  if (__size < 0x200) {
    __assert_fail("disk->super.sector_size >= sizeof(gpt_header)",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeftHandCold[P]diskclone/source/gpt/gpt-op.c"
                  ,0xda,"gpt_header *gpt_read_header(gpt_disk *, uint64_t, gpt_entry **)");
  }
  header = (gpt_header *)calloc(1,__size);
  if (header == (gpt_header *)0x0) goto LAB_00102bdc;
  ents = (gpt_entry *)0x0;
  _Var7 = lseek((disk->super).dev_fd,__size,0);
  if (_Var7 != -1) {
    uVar8 = read((disk->super).dev_fd,header,__size);
    if ((uVar8 == __size) && (header->signature == 0x5452415020494645)) {
      uVar1 = header->size;
      if ((0x5b < (ulong)uVar1) && (uVar1 <= (disk->super).sector_size)) {
        uVar2 = header->crc32;
        header->crc32 = 0;
        uVar4 = crc32(0xffffffff,(uchar *)header,(ulong)uVar1);
        header->crc32 = uVar2;
        if (((uVar4 ^ uVar2) == 0xffffffff) &&
           (ents = gpt_read_entries(disk,header), ents != (gpt_entry *)0x0)) {
          iVar5 = gpt_check_entryarr_crc(header,ents);
          if (iVar5 != 0) {
            if (((header->first_usable_lba <= header->last_usable_lba) &&
                (header->first_usable_lba != 0 || header->last_usable_lba < 2)) &&
               (header->my_lba == 1)) {
              disk->ents = ents;
              disk->pheader = header;
              (disk->super).nparts_max = (ulong)header->npartition_entries;
              return 1;
            }
          }
          goto LAB_00102bcc;
        }
      }
    }
    ents = (gpt_entry *)0x0;
  }
LAB_00102bcc:
  free(header);
  free(ents);
LAB_00102bdc:
  disk->pheader = (gpt_header *)0x0;
  return 0;
}

Assistant:

int gpt_probe_label(hd_context *ctx, gpt_disk *disk)
{
    int mbr_type;
    mbr_type = valid_pmbr(disk);
    if (!mbr_type)
        return 0;

    /* primary header */
    disk->pheader = gpt_read_header(disk, GPT_PRIMARY_PARTITION_TABLE_LBA,
                                   &disk->ents);

    /*TODO: bheader also needs to be read */
    if (!disk->pheader)
        return 0;

    disk->super.nparts_max = le32_to_cpu(disk->pheader->npartition_entries);

    return 1;
}